

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::
GetDescriberImpl<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>::ValuePolicy<testing::internal::EqMatcher<std::__cxx11::string>,false>>
          (MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<basic_string_view<char,_char_traits<char>_>_>_*,_const_EqMatcher<basic_string<char>_>_*>_>
  *ppMVar1;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> *in_RDI;
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_> **in_stack_ffffffffffffffe8;
  
  MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>::
  ValuePolicy<testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  ::Get(in_RDI);
  std::
  make_tuple<testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>const*,testing::internal::EqMatcher<std::__cxx11::string>const*>
            (in_stack_ffffffffffffffe8,
             (EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              **)in_RDI);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<std::basic_string_view<char,std::char_traits<char>>>const*,testing::internal::EqMatcher<std::__cxx11::string>const*>
                      ((tuple<const_testing::internal::MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>_*,_const_testing::internal::EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                        *)0x28031d);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }